

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  bool bVar4;
  cmGlobalGenerator *this_00;
  string *psVar5;
  bool collapse;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse_00;
  bool collapse_01;
  bool collapse_02;
  string file;
  string homeOutputDir;
  string homeDir;
  cmStateSnapshot snapshot;
  cmMakefile mf;
  string local_8a0;
  string local_880;
  string local_860;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_840;
  cmStateSnapshot local_838;
  undefined1 local_818 [16];
  cmState local_808 [3];
  
  pcVar2 = this->GlobalGenerator;
  this_00 = pcVar2;
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
    this_00 = (cmGlobalGenerator *)operator_new(0x608);
    cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  }
  if (path->_M_string_length != 0) {
    local_840 = args;
    cmState::Reset((cmStateSnapshot *)local_818,this->State);
    (this->CurrentSnapshot).Position.Position = local_808[0].PropertyDefinitions._M_t._M_impl._0_8_;
    (this->CurrentSnapshot).State = (cmState *)local_818._0_8_;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_818._8_8_;
    psVar5 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
    local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
    pcVar3 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,pcVar3,pcVar3 + psVar5->_M_string_length);
    psVar5 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    pcVar3 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_880,pcVar3,pcVar3 + psVar5->_M_string_length);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_818,(SystemTools *)0x1,collapse);
    SetHomeDirectory(this,(string *)local_818);
    collapse_00 = extraout_DL;
    if ((cmState *)local_818._0_8_ != local_808) {
      operator_delete((void *)local_818._0_8_,
                      local_808[0].PropertyDefinitions._M_t._M_impl._0_8_ + 1);
      collapse_00 = extraout_DL_00;
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_818,(SystemTools *)0x1,(bool)collapse_00);
    SetHomeOutputDirectory(this,(string *)local_818);
    if ((cmState *)local_818._0_8_ != local_808) {
      operator_delete((void *)local_818._0_8_,
                      local_808[0].PropertyDefinitions._M_t._M_impl._0_8_ + 1);
    }
    local_838.Position.Position = (this->CurrentSnapshot).Position.Position;
    local_838.State = (this->CurrentSnapshot).State;
    local_838.Position.Tree = (this->CurrentSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_818,&local_838);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_8a0,(SystemTools *)0x1,collapse_01);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_818,&local_8a0);
    paVar1 = &local_8a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    }
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_818,&local_838);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_8a0,(SystemTools *)0x1,collapse_02);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_818,&local_8a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    }
    cmStateSnapshot::SetDefaultDefinitions(&local_838);
    cmMakefile::cmMakefile((cmMakefile *)local_818,this_00,&local_838);
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      cmsys::SystemTools::CollapseFullPath(&local_8a0,path);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_8a0);
      cmMakefile::SetScriptModeFile((cmMakefile *)local_818,&local_8a0);
      cmMakefile::SetArgcArgv((cmMakefile *)local_818,local_840);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
      }
    }
    bVar4 = cmMakefile::ReadListFile((cmMakefile *)local_818,path);
    if (!bVar4) {
      std::operator+(&local_8a0,"Error processing file: ",path);
      cmSystemTools::Error(&local_8a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
      }
    }
    SetHomeDirectory(this,&local_860);
    SetHomeOutputDirectory(this,&local_880);
    cmMakefile::~cmMakefile((cmMakefile *)local_818);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
  }
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
    (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const std::string& path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg) {
    gg = new cmGlobalGenerator(this);
    created = true;
  }

  // read in the list file to fill the cache
  if (!path.empty()) {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.GetDirectory().SetCurrentSource(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.SetDefaultDefinitions();
    cmMakefile mf(gg, snapshot);
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf.SetScriptModeFile(file);

      mf.SetArgcArgv(args);
    }
    if (!mf.ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: " + path);
    }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
  }

  // free generic one if generated
  if (created) {
    delete gg;
  }
}